

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool __thiscall
basist::basisu_lowlevel_uastc_transcoder::transcode_slice
          (basisu_lowlevel_uastc_transcoder *this,void *pDst_blocks,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint8_t *pImage_data,uint32_t image_data_size,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,bool bc1_allow_threecolor_blocks,
          bool has_alpha,uint32_t orig_width,uint32_t orig_height,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          uint32_t output_rows_in_pixels,int channel0,int channel1,uint32_t decode_flags)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  short sVar8;
  uint32_t uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  color32 *pcVar16;
  ulong uVar17;
  undefined8 *pDst;
  void *pvVar18;
  color32 *pcVar19;
  uint8_t *puVar20;
  ulong uVar21;
  ulong uVar22;
  color32 *pcVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  color32 block_pixels [4] [4];
  uint32_t local_104;
  uint32_t local_fc;
  uint32_t local_f4;
  color32 local_78 [18];
  
  if (g_transcoder_initialized == '\0') {
    __assert_fail("g_transcoder_initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2429,
                  "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                 );
  }
  local_104 = output_row_pitch_in_blocks_or_pixels;
  if (((output_row_pitch_in_blocks_or_pixels == 0) && (local_104 = orig_width, 8 < fmt - cRGB32)) &&
     (local_104 = num_blocks_x, fmt == cFXT1_RGB)) {
    local_104 = orig_width + 7 >> 3;
  }
  if (output_rows_in_pixels != 0) {
    orig_height = output_rows_in_pixels;
  }
  if (8 < fmt - cRGB32) {
    orig_height = output_rows_in_pixels;
  }
  if (image_data_size < num_blocks_x * num_blocks_y * 0x10) {
    bVar6 = false;
  }
  else {
    bVar6 = (bool)((byte)decode_flags >> 2 & has_alpha);
    if ((fmt & ~cETC2_RGBA) == cPVRTC1_4_RGB) {
      if (fmt == cPVRTC1_4_RGBA) {
        transcode_uastc_to_pvrtc1_4_rgba
                  ((uastc_block *)pImage_data,pDst_blocks,num_blocks_x,num_blocks_y,false);
      }
      else {
        transcode_uastc_to_pvrtc1_4_rgb
                  ((uastc_block *)pImage_data,pDst_blocks,num_blocks_x,num_blocks_y,false,bVar6);
      }
    }
    else if (num_blocks_y != 0) {
      local_f4 = channel1;
      local_fc = channel0;
      lVar4 = (ulong)local_104 * 2;
      uVar15 = 0;
      do {
        bVar26 = num_blocks_x != 0;
        if (num_blocks_x != 0) {
          if ((cUASTC_4x4 < fmt) || ((0x634c133fU >> (fmt & cTotalBlockFormats) & 1) == 0)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2502,
                          "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                         );
          }
          iVar10 = (int)uVar15;
          pDst = (undefined8 *)
                 ((ulong)(local_104 * output_block_or_pixel_stride_in_bytes * iVar10) +
                 (long)pDst_blocks);
          uVar9 = iVar10 * 4;
          iVar11 = uVar9 * local_104;
          uVar12 = orig_height + iVar10 * -4;
          if (3 < (int)uVar12) {
            uVar12 = 4;
          }
          uVar14 = (ulong)uVar12;
          uVar17 = 0;
          do {
            iVar10 = (int)uVar17;
            switch(fmt) {
            case cETC1:
              if (bVar6 == false) {
                bVar7 = transcode_uastc_to_etc1((uastc_block *)pImage_data,pDst);
              }
              else {
                bVar7 = transcode_uastc_to_etc1((uastc_block *)pImage_data,pDst,3);
              }
              break;
            case cETC2_RGBA:
              bVar7 = transcode_uastc_to_etc2_rgba((uastc_block *)pImage_data,pDst);
              break;
            case cBC1:
              bVar7 = transcode_uastc_to_bc1
                                ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0)
                                );
              break;
            case cBC3:
              bVar7 = transcode_uastc_to_bc3
                                ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0)
                                );
              break;
            case cBC4:
              if ((int)local_fc < 1) {
                local_fc = 0;
              }
              bVar7 = transcode_uastc_to_bc4((uastc_block *)pImage_data,pDst,false,local_fc);
              break;
            case cBC5:
              if ((int)local_fc < 1) {
                local_fc = 0;
              }
              if ((int)local_f4 < 0) {
                local_f4 = 3;
              }
              bVar7 = transcode_uastc_to_bc5
                                ((uastc_block *)pImage_data,pDst,false,local_fc,local_f4);
              break;
            default:
              bVar7 = unpack_uastc((uastc_block *)pImage_data,local_78,false);
              if (output_block_or_pixel_stride_in_bytes != 2) {
                __assert_fail("sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x24eb,
                              "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                             );
              }
              if (orig_height != uVar9) {
                uVar12 = local_104 + iVar10 * -4;
                if (3 < (int)uVar12) {
                  uVar12 = 4;
                }
                pvVar18 = (void *)((long)pDst_blocks + (ulong)(uint)(iVar11 + iVar10 * 4) * 2);
                puVar20 = &local_78[0].field_0.field_0.a;
                uVar21 = 0;
                do {
                  if (local_104 != iVar10 * 4) {
                    uVar22 = 1;
                    uVar24 = 0;
                    do {
                      iVar2 = ((uint)puVar20[uVar24 * 4 + -3] + (uint)puVar20[uVar24 * 4 + -3] * 4)
                              * 3;
                      iVar25 = ((uint)puVar20[uVar24 * 4 + -2] + (uint)puVar20[uVar24 * 4 + -2] * 4)
                               * 3;
                      iVar3 = ((uint)puVar20[uVar24 * 4 + -1] + (uint)puVar20[uVar24 * 4 + -1] * 4)
                              * 3;
                      uVar13 = iVar3 + (iVar3 + 0x80U >> 8) + 0x80 >> 4;
                      iVar3 = ((uint)puVar20[uVar24 * 4] + (uint)puVar20[uVar24 * 4] * 4) * 3;
                      *(byte *)((long)pvVar18 + (ulong)((int)uVar22 - 1)) =
                           (byte)((iVar3 + 0x80U >> 8) + iVar3 + 0x80 >> 8) | (byte)uVar13 & 0xf0;
                      *(byte *)((long)pvVar18 + uVar22) =
                           (byte)(uVar13 >> 8) |
                           (byte)((iVar25 + 0x80U >> 8) + iVar25 + 0x80 >> 8) & 0x3f |
                           (byte)((((iVar2 + 0x80U >> 8) + iVar2 + 0x80 & 0xf00) << 4) >> 8);
                      uVar24 = uVar24 + 1;
                      uVar22 = (ulong)((int)uVar22 + 2);
                    } while (uVar24 < uVar12);
                  }
                  pvVar18 = (void *)((long)pvVar18 + lVar4);
                  uVar21 = uVar21 + 1;
                  puVar20 = puVar20 + 0x10;
                } while (uVar21 < uVar14);
              }
              break;
            case cBC7:
            case cBC7_M5_COLOR:
              bVar7 = transcode_uastc_to_bc7((uastc_block *)pImage_data,pDst);
              break;
            case cASTC_4x4:
              bVar7 = transcode_uastc_to_astc((uastc_block *)pImage_data,pDst);
              break;
            case cETC2_EAC_R11:
              if ((int)local_fc < 1) {
                local_fc = 0;
              }
              bVar7 = transcode_uastc_to_etc2_eac_r11
                                ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0)
                                 ,local_fc);
              break;
            case cETC2_EAC_RG11:
              if ((int)local_fc < 1) {
                local_fc = 0;
              }
              if ((int)local_f4 < 0) {
                local_f4 = 3;
              }
              bVar7 = transcode_uastc_to_etc2_eac_rg11
                                ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0)
                                 ,local_fc,local_f4);
              break;
            case cRGBA32:
              bVar7 = unpack_uastc((uastc_block *)pImage_data,local_78,false);
              if (output_block_or_pixel_stride_in_bytes != 4) {
                __assert_fail("sizeof(uint32_t) == output_block_or_pixel_stride_in_bytes",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x24b1,
                              "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                             );
              }
              if (orig_height != uVar9) {
                uVar12 = local_104 + iVar10 * -4;
                if (3 < (int)uVar12) {
                  uVar12 = 4;
                }
                pvVar18 = (void *)((long)pDst_blocks + (ulong)(uint)(iVar11 + iVar10 * 4) * 4);
                pcVar19 = local_78;
                uVar21 = 0;
                do {
                  if (local_104 != iVar10 * 4) {
                    uVar22 = 0;
                    uVar24 = 0;
                    do {
                      *(undefined4 *)((long)pvVar18 + (uVar22 & 0xffffffff)) =
                           *(undefined4 *)((long)&pcVar19->field_0 + uVar22);
                      uVar24 = uVar24 + 1;
                      uVar22 = uVar22 + 4;
                    } while (uVar24 < uVar12);
                  }
                  pvVar18 = (void *)((long)pvVar18 + (ulong)local_104 * 4);
                  uVar21 = uVar21 + 1;
                  pcVar19 = pcVar19 + 4;
                } while (uVar21 < uVar14);
              }
              break;
            case cRGB565:
            case cBGR565:
              bVar7 = unpack_uastc((uastc_block *)pImage_data,local_78,false);
              if (output_block_or_pixel_stride_in_bytes != 2) {
                __assert_fail("sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x24ce,
                              "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                             );
              }
              if (orig_height != uVar9) {
                uVar12 = local_104 + iVar10 * -4;
                if (3 < (int)uVar12) {
                  uVar12 = 4;
                }
                pvVar18 = (void *)((long)pDst_blocks + (ulong)(uint)(iVar11 + iVar10 * 4) * 2);
                pcVar19 = local_78;
                uVar21 = 0;
                do {
                  if (local_104 != iVar10 * 4) {
                    uVar22 = 1;
                    uVar24 = 0;
                    pcVar23 = pcVar19;
                    do {
                      if (fmt == cRGB565) {
                        iVar2 = (uint)(pcVar23->field_0).field_0.r * 0x1f;
                        bVar1 = (pcVar23->field_0).field_0.g;
                        iVar25 = (uint)bVar1 * 0x40 - (uint)bVar1;
                        sVar8 = ((ushort)((iVar25 + 0x80U >> 8) + iVar25 + 0x80 >> 3) & 0x1fe0) +
                                ((short)((uint)(iVar2 + 0x80) >> 8) + (short)iVar2 + 0x80U & 0x7f00)
                                * 8;
                        pcVar16 = (color32 *)((long)&local_78[uVar21 * 4 + uVar24].field_0 + 2);
                      }
                      else {
                        iVar2 = (uint)(pcVar23->field_0).field_0.b * 0x1f;
                        iVar25 = (uint)(pcVar23->field_0).field_0.g * 0x3f;
                        sVar8 = ((ushort)((iVar25 + 0x80U >> 8) + iVar25 + 0x80 >> 3) & 0x1fe0) +
                                ((short)((uint)(iVar2 + 0x80) >> 8) + (short)iVar2 + 0x80U & 0x7f00)
                                * 8;
                        pcVar16 = pcVar23;
                      }
                      iVar2 = (uint)(pcVar16->field_0).field_0.r * 0x1f;
                      *(byte *)((long)pvVar18 + (ulong)((int)uVar22 - 1)) =
                           (byte)((iVar2 + 0x80U >> 8) + iVar2 + 0x80 >> 8) | (byte)sVar8;
                      *(char *)((long)pvVar18 + uVar22) = (char)((ushort)sVar8 >> 8);
                      uVar24 = uVar24 + 1;
                      pcVar23 = pcVar23 + 1;
                      uVar22 = (ulong)((int)uVar22 + 2);
                    } while (uVar24 < uVar12);
                  }
                  pvVar18 = (void *)((long)pvVar18 + lVar4);
                  uVar21 = uVar21 + 1;
                  pcVar19 = pcVar19 + 4;
                } while (uVar21 < uVar14);
              }
              break;
            case cUASTC_4x4:
              uVar5 = *(undefined8 *)((long)&((uastc_block *)pImage_data)->field_0 + 8);
              *pDst = *(undefined8 *)&((uastc_block *)pImage_data)->field_0;
              pDst[1] = uVar5;
              bVar7 = true;
            }
            if (bVar7 == false) break;
            uVar17 = uVar17 + 1;
            pImage_data = (uint8_t *)((long)pImage_data + 0x10);
            pDst = (undefined8 *)((long)pDst + (ulong)output_block_or_pixel_stride_in_bytes);
            bVar26 = uVar17 < num_blocks_x;
          } while (uVar17 != num_blocks_x + (num_blocks_x == 0));
        }
        if ((bVar26 != false) || (uVar15 = uVar15 + 1, uVar15 == num_blocks_y)) {
          return (bool)(bVar26 ^ 1);
        }
      } while( true );
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool basisu_lowlevel_uastc_transcoder::transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
        uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, bool has_alpha, const uint32_t orig_width, const uint32_t orig_height, uint32_t output_row_pitch_in_blocks_or_pixels,
		basisu_transcoder_state* pState, uint32_t output_rows_in_pixels, int channel0, int channel1, uint32_t decode_flags)
	{
		BASISU_NOTE_UNUSED(pState);
		BASISU_NOTE_UNUSED(bc1_allow_threecolor_blocks);

		assert(g_transcoder_initialized);
		if (!g_transcoder_initialized)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: Transcoder not globally initialized.\n");
			return false;
		}

#if BASISD_SUPPORT_UASTC
		const uint32_t total_blocks = num_blocks_x * num_blocks_y;

		if (!output_row_pitch_in_blocks_or_pixels)
		{
			if (basis_block_format_is_uncompressed(fmt))
				output_row_pitch_in_blocks_or_pixels = orig_width;
			else
			{
				if (fmt == block_format::cFXT1_RGB)
					output_row_pitch_in_blocks_or_pixels = (orig_width + 7) / 8;
				else
					output_row_pitch_in_blocks_or_pixels = num_blocks_x;
			}
		}

		if (basis_block_format_is_uncompressed(fmt))
		{
			if (!output_rows_in_pixels)
				output_rows_in_pixels = orig_height;
		}

		uint32_t total_expected_block_bytes = sizeof(uastc_block) * total_blocks;
		if (image_data_size < total_expected_block_bytes)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: image_data_size < total_expected_block_bytes The file is corrupted or this is a bug.\n");
			return false;
		}

		const uastc_block* pSource_block = reinterpret_cast<const uastc_block *>(pImage_data);

		const bool high_quality = (decode_flags & cDecodeFlagsHighQuality) != 0;
		const bool from_alpha = has_alpha && (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;

		bool status = false;
		if ((fmt == block_format::cPVRTC1_4_RGB) || (fmt == block_format::cPVRTC1_4_RGBA))
		{
			if (fmt == block_format::cPVRTC1_4_RGBA)
				transcode_uastc_to_pvrtc1_4_rgba((const uastc_block*)pImage_data, pDst_blocks, num_blocks_x, num_blocks_y, high_quality);
			else
				transcode_uastc_to_pvrtc1_4_rgb((const uastc_block *)pImage_data, pDst_blocks, num_blocks_x, num_blocks_y, high_quality, from_alpha);
		}
		else
		{
			for (uint32_t block_y = 0; block_y < num_blocks_y; ++block_y)
			{
				void* pDst_block = (uint8_t*)pDst_blocks + block_y * output_row_pitch_in_blocks_or_pixels * output_block_or_pixel_stride_in_bytes;
								
				for (uint32_t block_x = 0; block_x < num_blocks_x; ++block_x, ++pSource_block, pDst_block = (uint8_t *)pDst_block + output_block_or_pixel_stride_in_bytes)
				{
					switch (fmt)
					{
					case block_format::cUASTC_4x4:
					{
						memcpy(pDst_block, pSource_block, sizeof(uastc_block));
						status = true;
						break;
					}
					case block_format::cETC1:
					{
						if (from_alpha)
							status = transcode_uastc_to_etc1(*pSource_block, pDst_block, 3);
						else
							status = transcode_uastc_to_etc1(*pSource_block, pDst_block);
						break;
					}
					case block_format::cETC2_RGBA:
					{
						status = transcode_uastc_to_etc2_rgba(*pSource_block, pDst_block);
						break;
					}
					case block_format::cBC1:
					{
						status = transcode_uastc_to_bc1(*pSource_block, pDst_block, high_quality);
						break;
					}
					case block_format::cBC3:
					{
						status = transcode_uastc_to_bc3(*pSource_block, pDst_block, high_quality);
						break;
					}
					case block_format::cBC4:
					{
						if (channel0 < 0) 
							channel0 = 0;
						status = transcode_uastc_to_bc4(*pSource_block, pDst_block, high_quality, channel0);
						break;
					}
					case block_format::cBC5:
					{
						if (channel0 < 0)
							channel0 = 0;
						if (channel1 < 0)
							channel1 = 3;
						status = transcode_uastc_to_bc5(*pSource_block, pDst_block, high_quality, channel0, channel1);
						break;
					}
					case block_format::cBC7:
					case block_format::cBC7_M5_COLOR: // for consistently with ETC1S
					{
						status = transcode_uastc_to_bc7(*pSource_block, pDst_block);
						break;
					}
					case block_format::cASTC_4x4:
					{
						status = transcode_uastc_to_astc(*pSource_block, pDst_block);
						break;
					}
					case block_format::cETC2_EAC_R11:
					{
						if (channel0 < 0)
							channel0 = 0;
						status = transcode_uastc_to_etc2_eac_r11(*pSource_block, pDst_block, high_quality, channel0);
						break;
					}
					case block_format::cETC2_EAC_RG11:
					{
						if (channel0 < 0)
							channel0 = 0;
						if (channel1 < 0)
							channel1 = 3;
						status = transcode_uastc_to_etc2_eac_rg11(*pSource_block, pDst_block, high_quality, channel0, channel1);
						break;
					}
					case block_format::cRGBA32:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32 *)block_pixels, false);

						assert(sizeof(uint32_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint32_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								pDst_pixels[0 + 4 * x] = c.r;
								pDst_pixels[1 + 4 * x] = c.g;
								pDst_pixels[2 + 4 * x] = c.b;
								pDst_pixels[3 + 4 * x] = c.a;
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint32_t);
						}

						break;
					}
					case block_format::cRGB565:
					case block_format::cBGR565:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32*)block_pixels, false);

						assert(sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint16_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								const uint16_t packed = (fmt == block_format::cRGB565) ? static_cast<uint16_t>((mul_8(c.r, 31) << 11) | (mul_8(c.g, 63) << 5) | mul_8(c.b, 31)) :
									static_cast<uint16_t>((mul_8(c.b, 31) << 11) | (mul_8(c.g, 63) << 5) | mul_8(c.r, 31));

								pDst_pixels[x * 2 + 0] = (uint8_t)(packed & 0xFF);
								pDst_pixels[x * 2 + 1] = (uint8_t)((packed >> 8) & 0xFF);
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint16_t);
						}

						break;
					}
					case block_format::cRGBA4444:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32*)block_pixels, false);

						assert(sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint16_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								const uint16_t packed = static_cast<uint16_t>((mul_8(c.r, 15) << 12) | (mul_8(c.g, 15) << 8) | (mul_8(c.b, 15) << 4) | mul_8(c.a, 15));

								pDst_pixels[x * 2 + 0] = (uint8_t)(packed & 0xFF);
								pDst_pixels[x * 2 + 1] = (uint8_t)((packed >> 8) & 0xFF);
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint16_t);
						}
						break;
					}
					default:
						assert(0);
						break;

					}

					if (!status)
					{
						BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: Transcoder failed to unpack a UASTC block - this is a bug, or the data was corrupted\n");
						return false;
					}

				} // block_x

			} // block_y
		}

		return true;
#else
		BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: UASTC is unsupported\n");

		BASISU_NOTE_UNUSED(decode_flags);
		BASISU_NOTE_UNUSED(channel0);
		BASISU_NOTE_UNUSED(channel1);
		BASISU_NOTE_UNUSED(output_rows_in_pixels);
		BASISU_NOTE_UNUSED(output_row_pitch_in_blocks_or_pixels);
		BASISU_NOTE_UNUSED(output_block_or_pixel_stride_in_bytes);
		BASISU_NOTE_UNUSED(fmt);
		BASISU_NOTE_UNUSED(image_data_size);
		BASISU_NOTE_UNUSED(pImage_data);
		BASISU_NOTE_UNUSED(num_blocks_x);
		BASISU_NOTE_UNUSED(num_blocks_y);
		BASISU_NOTE_UNUSED(pDst_blocks);

		return false;
#endif
	}